

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O2

double __thiscall
sector_t::NextHighestCeilingAt
          (sector_t *this,double x,double y,double bottomz,double topz,int flags,
          sector_t **resultsec,F3DFloor **resultffloor)

{
  F3DFloor *pFVar1;
  secplane_t *psVar2;
  sector_t *psVar3;
  sector_t *psVar4;
  uint uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  psVar3 = this;
  dVar9 = -3.4028234663852886e+38;
  while( true ) {
    dVar7 = (y * (psVar3->ceilingplane).normal.Y +
            (psVar3->ceilingplane).normal.X * x + (psVar3->ceilingplane).D) *
            (psVar3->ceilingplane).negiC;
    uVar5 = (psVar3->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
    while (uVar5 = uVar5 - 1, -1 < (int)uVar5) {
      pFVar1 = (psVar3->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array
               [uVar5 & 0x7fffffff];
      if ((~pFVar1->flags & 3) == 0) {
        psVar2 = (pFVar1->bottom).plane;
        dVar6 = ((psVar2->normal).Y * y + psVar2->D + (psVar2->normal).X * x) * psVar2->negiC;
        if ((dVar6 < dVar7) &&
           (psVar2 = (pFVar1->top).plane,
           dVar8 = (((psVar2->normal).Y * y + psVar2->D + (psVar2->normal).X * x) * psVar2->negiC -
                   dVar6) * 0.5 + dVar6, ABS(topz - dVar8) < ABS(bottomz - dVar8))) {
          if (resultsec != (sector_t **)0x0) {
            *resultsec = psVar3;
          }
          if (resultffloor == (F3DFloor **)0x0) {
            return dVar6;
          }
          *resultffloor = pFVar1;
          return dVar6;
        }
      }
    }
    psVar4 = this;
    if (((flags & 0x10U) != 0) || (psVar4 = psVar3, (psVar3->planes[1].Flags & 0x1d0U) != 0x100))
    break;
    dVar6 = sectorPortals.Array[psVar3->Portals[1]].mPlaneZ;
    if (dVar6 <= dVar9) break;
    x = x + sectorPortals.Array[psVar3->Portals[1]].mDisplacement.X;
    y = y + sectorPortals.Array[psVar3->Portals[1]].mDisplacement.Y;
    psVar3 = P_PointInSector(x,y);
    dVar9 = dVar6;
  }
  if (resultffloor != (F3DFloor **)0x0) {
    *resultffloor = (F3DFloor *)0x0;
  }
  if (resultsec != (sector_t **)0x0) {
    *resultsec = psVar4;
  }
  return dVar7;
}

Assistant:

double sector_t::NextHighestCeilingAt(double x, double y, double bottomz, double topz, int flags, sector_t **resultsec, F3DFloor **resultffloor)
{
	sector_t *sec = this;
	double planeheight = -FLT_MAX;

	while (true)
	{
		// Looking through planes from bottom to top
		double realceil = sec->ceilingplane.ZatPoint(x, y);
		for (int i = sec->e->XFloor.ffloors.Size() - 1; i >= 0; --i)
		{
			F3DFloor *rover = sec->e->XFloor.ffloors[i];
			if (!(rover->flags & FF_SOLID) || !(rover->flags & FF_EXISTS)) continue;

			double ff_bottom = rover->bottom.plane->ZatPoint(x, y);
			double ff_top = rover->top.plane->ZatPoint(x, y);

			double delta1 = bottomz - (ff_bottom + ((ff_top - ff_bottom) / 2));
			double delta2 = topz - (ff_bottom + ((ff_top - ff_bottom) / 2));

			if (ff_bottom < realceil && fabs(delta1) > fabs(delta2))
			{ 
				if (resultsec) *resultsec = sec;
				if (resultffloor) *resultffloor = rover;
				return ff_bottom;
			}
		}
		if ((flags & FFCF_NOPORTALS) || sec->PortalBlocksMovement(ceiling) || planeheight >= sec->GetPortalPlaneZ(ceiling))
		{ // Use sector's floor
			if (resultffloor) *resultffloor = NULL;
			if (resultsec) *resultsec = sec;
			return realceil;
		}
		else
		{
			DVector2 pos = sec->GetPortalDisplacement(ceiling);
			x += pos.X;
			y += pos.Y;
			planeheight = sec->GetPortalPlaneZ(ceiling);
			sec = P_PointInSector(x, y);
		}
	}
}